

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactBundleDirNameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactBundleDirNameTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  _Base_ptr p_Var1;
  bool bVar2;
  string config;
  string local_60;
  string local_40;
  
  bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  if (bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"TARGET_BUNDLE_DIR_NAME not allowed for IMPORTED targets.","");
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  else {
    bVar2 = cmGeneratorTarget::IsBundleOnApple((cmGeneratorTarget *)this);
    if (bVar2) {
      p_Var1 = (target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,p_Var1,
                 (long)&p_Var1->_M_color +
                 (long)&((target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                        _M_color);
      bVar2 = cmGeneratorTarget::IsAppBundleOnApple((cmGeneratorTarget *)this);
      if (bVar2) {
        cmGeneratorTarget::GetAppBundleDirectory
                  (__return_storage_ptr__,(cmGeneratorTarget *)this,&local_60,BundleDirLevel);
      }
      else {
        bVar2 = cmGeneratorTarget::IsFrameworkOnApple((cmGeneratorTarget *)this);
        if (bVar2) {
          cmGeneratorTarget::GetFrameworkDirectory
                    (__return_storage_ptr__,(cmGeneratorTarget *)this,&local_60,BundleDirLevel);
        }
        else {
          bVar2 = cmGeneratorTarget::IsCFBundleOnApple((cmGeneratorTarget *)this);
          if (bVar2) {
            cmGeneratorTarget::GetCFBundleDirectory
                      (__return_storage_ptr__,(cmGeneratorTarget *)this,&local_60,BundleDirLevel);
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"TARGET_BUNDLE_DIR_NAME is allowed only for Bundle targets.","");
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    if (target->IsImported()) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_BUNDLE_DIR_NAME not allowed for IMPORTED targets.");
      return std::string();
    }
    if (!target->IsBundleOnApple()) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_BUNDLE_DIR_NAME is allowed only for Bundle targets.");
      return std::string();
    }

    auto level = cmGeneratorTarget::BundleDirLevel;
    auto config = context->Config;
    if (target->IsAppBundleOnApple()) {
      return target->GetAppBundleDirectory(config, level);
    }
    if (target->IsFrameworkOnApple()) {
      return target->GetFrameworkDirectory(config, level);
    }
    if (target->IsCFBundleOnApple()) {
      return target->GetCFBundleDirectory(config, level);
    }
    return std::string();
  }